

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmSetPropertyCommand::HandleSourceMode(cmSetPropertyCommand *this)

{
  _Rb_tree_header *p_Var1;
  cmSourceFile *sf;
  _Rb_tree_node_base *p_Var2;
  ostream *poVar3;
  ostringstream e;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  p_Var2 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Names)._M_t._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)p_Var2 == p_Var1) {
LAB_0036ec0c:
      return (_Rb_tree_header *)p_Var2 == p_Var1;
    }
    sf = cmMakefile::GetOrCreateSource
                   ((this->super_cmCommand).Makefile,(string *)(p_Var2 + 1),false);
    if (sf == (cmSourceFile *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar3 = std::operator<<((ostream *)local_1a0,
                               "given SOURCE name that could not be found or created: ");
      std::operator<<(poVar3,(string *)(p_Var2 + 1));
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
      goto LAB_0036ec0c;
    }
    HandleSource(this,sf);
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

bool cmSetPropertyCommand::HandleSourceMode()
{
  for (std::set<std::string>::const_iterator ni = this->Names.begin();
       ni != this->Names.end(); ++ni) {
    // Get the source file.
    if (cmSourceFile* sf = this->Makefile->GetOrCreateSource(*ni)) {
      if (!this->HandleSource(sf)) {
        return false;
      }
    } else {
      std::ostringstream e;
      e << "given SOURCE name that could not be found or created: " << *ni;
      this->SetError(e.str());
      return false;
    }
  }
  return true;
}